

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_interface_test.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_6cacf::StatTestTwoStep::~StatTestTwoStep(StatTestTwoStep *this)

{
  StatTest::~StatTest(&this->super_StatTest);
  operator_delete(this,0x1a8);
  return;
}

Assistant:

TEST_F(StatTest, TwoStep) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"build out: cat mid\n"
"build mid: cat in\n"));

  Node* out = GetNode("out");
  string err;
  EXPECT_TRUE(out->Stat(this, &err));
  EXPECT_EQ("", err);
  ASSERT_EQ(1u, stats_.size());
  scan_.RecomputeDirty(out, NULL);
  ASSERT_EQ(3u, stats_.size());
  ASSERT_EQ("out", stats_[0]);
  ASSERT_TRUE(GetNode("out")->dirty());
  ASSERT_EQ("mid",  stats_[1]);
  ASSERT_TRUE(GetNode("mid")->dirty());
  ASSERT_EQ("in",  stats_[2]);
}